

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::
addEvent<int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,int **args,
          unique_ptr<int,_std::default_delete<int>_> *args_1,shared_ptr<int> *args_2)

{
  ulong minQueueCapacity;
  int *piVar1;
  Queue *pQVar2;
  void *result;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long local_58 [2];
  uint local_48;
  undefined4 uStack_44;
  uint uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_58[0] = 8;
  local_58[1] = 8;
  piVar1 = (args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  uVar7 = -(uint)((int)*args == 0 && (int)((ulong)*args >> 0x20) == 0);
  uVar8 = -(uint)((int)piVar1 == 0 && (int)((ulong)piVar1 >> 0x20) == 0);
  local_48 = uVar7 & 1 | ~uVar7 & 5;
  uStack_44 = 0;
  uStack_40 = uVar8 & 1 | ~uVar8 & 5;
  uStack_3c = 0;
  local_38 = (ulong)((args_2->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
                    (element_type *)0x0) * 4 + 1;
  lVar6 = 0;
  lVar3 = 0;
  do {
    lVar6 = lVar6 + *(long *)((long)local_58 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x28);
  minQueueCapacity = lVar6 + 4;
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) {
    sVar4 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar4 < minQueueCapacity) &&
        (replaceChannel(this,minQueueCapacity),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
       (sVar4 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar4 < minQueueCapacity)) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)lVar6;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 4;
  *(uint64_t *)(pcVar5 + 4) = eventSourceId;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 8;
  *(uint64_t *)(pcVar5 + 8) = clock;
  pcVar5 = (this->_qw)._writePos + 8;
  (this->_qw)._writePos = pcVar5;
  if (*args == (int *)0x0) {
    *pcVar5 = '\0';
    lVar3 = 1;
  }
  else {
    *pcVar5 = '\x01';
    pcVar5 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar5 + 1;
    *(int *)(pcVar5 + 1) = **args;
    lVar3 = 4;
  }
  pcVar5 = (this->_qw)._writePos + lVar3;
  (this->_qw)._writePos = pcVar5;
  if ((args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl == (int *)0x0) {
    *pcVar5 = '\0';
    lVar3 = 1;
  }
  else {
    *pcVar5 = '\x01';
    pcVar5 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar5 + 1;
    *(int *)(pcVar5 + 1) =
         *(args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl;
    lVar3 = 4;
  }
  pcVar5 = (this->_qw)._writePos + lVar3;
  (this->_qw)._writePos = pcVar5;
  if ((args_2->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == (element_type *)0x0) {
    *pcVar5 = '\0';
    lVar3 = 1;
  }
  else {
    *pcVar5 = '\x01';
    pcVar5 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar5 + 1;
    *(element_type *)(pcVar5 + 1) =
         *(args_2->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    lVar3 = 4;
  }
  pcVar5 = (this->_qw)._writePos + lVar3;
  (this->_qw)._writePos = pcVar5;
  pQVar2 = (this->_qw)._queue;
  (pQVar2->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar5 - (long)pQVar2->buffer
  ;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}